

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_mechanism.cpp
# Opt level: O1

int __thiscall zmq::null_mechanism_t::process_handshake_command(null_mechanism_t *this,msg_t *msg_)

{
  int iVar1;
  socket_base_t *psVar2;
  endpoint_uri_pair_t *peVar3;
  int *piVar4;
  size_t data_size_;
  
  if (((this->super_zap_client_t).field_0x4a != '\0') ||
     ((this->super_zap_client_t).field_0x4b == '\x01')) {
    psVar2 = session_base_t::get_socket(*(session_base_t **)&this->field_0x5e0);
    peVar3 = session_base_t::get_endpoint(*(session_base_t **)&this->field_0x5e0);
    socket_base_t::event_handshake_failed_protocol(psVar2,peVar3,0x10000001);
    piVar4 = __errno_location();
    *piVar4 = 0x47;
    return -1;
  }
  peVar3 = (endpoint_uri_pair_t *)msg_t::data(msg_);
  data_size_ = msg_t::size(msg_);
  if (5 < data_size_) {
    if (*(short *)((long)&(peVar3->local)._M_dataplus._M_p + 4) == 0x5944 &&
        *(int *)&(peVar3->local)._M_dataplus._M_p == 0x41455205) {
      (this->super_zap_client_t).field_0x4a = 1;
      peVar3 = (endpoint_uri_pair_t *)((long)&(peVar3->local)._M_dataplus._M_p + 6);
      iVar1 = mechanism_t::parse_metadata
                        ((mechanism_t *)&(this->super_zap_client_t).field_0x50,(uchar *)peVar3,
                         data_size_ - 6,false);
      goto LAB_001a2ed7;
    }
    if (*(short *)((long)&(peVar3->local)._M_dataplus._M_p + 4) == 0x524f &&
        *(int *)&(peVar3->local)._M_dataplus._M_p == 0x52524505) {
      iVar1 = process_error_command(this,(uchar *)peVar3,data_size_);
      goto LAB_001a2ed7;
    }
  }
  psVar2 = session_base_t::get_socket(*(session_base_t **)&this->field_0x5e0);
  peVar3 = session_base_t::get_endpoint(*(session_base_t **)&this->field_0x5e0);
  socket_base_t::event_handshake_failed_protocol(psVar2,peVar3,0x10000001);
  piVar4 = __errno_location();
  *piVar4 = 0x47;
  iVar1 = -1;
LAB_001a2ed7:
  if (iVar1 == 0) {
    iVar1 = msg_t::close(msg_,(int)peVar3);
    if (iVar1 != 0) {
      process_handshake_command();
    }
    iVar1 = msg_t::init(msg_,(EVP_PKEY_CTX *)peVar3);
    if (iVar1 != 0) {
      process_handshake_command();
    }
  }
  return iVar1;
}

Assistant:

int zmq::null_mechanism_t::process_handshake_command (msg_t *msg_)
{
    if (_ready_command_received || _error_command_received) {
        session->get_socket ()->event_handshake_failed_protocol (
          session->get_endpoint (), ZMQ_PROTOCOL_ERROR_ZMTP_UNEXPECTED_COMMAND);
        errno = EPROTO;
        return -1;
    }

    const unsigned char *cmd_data =
      static_cast<unsigned char *> (msg_->data ());
    const size_t data_size = msg_->size ();

    int rc = 0;
    if (data_size >= ready_command_name_len
        && !memcmp (cmd_data, ready_command_name, ready_command_name_len))
        rc = process_ready_command (cmd_data, data_size);
    else if (data_size >= error_command_name_len
             && !memcmp (cmd_data, error_command_name, error_command_name_len))
        rc = process_error_command (cmd_data, data_size);
    else {
        session->get_socket ()->event_handshake_failed_protocol (
          session->get_endpoint (), ZMQ_PROTOCOL_ERROR_ZMTP_UNEXPECTED_COMMAND);
        errno = EPROTO;
        rc = -1;
    }

    if (rc == 0) {
        rc = msg_->close ();
        errno_assert (rc == 0);
        rc = msg_->init ();
        errno_assert (rc == 0);
    }
    return rc;
}